

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  long lVar1;
  undefined1 auVar2 [16];
  void **vtt;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  long *in_RSI;
  TPZRegisterClassId *in_RDI;
  longdouble *end;
  longdouble *dst;
  longdouble *src;
  int64_t size;
  char *in_stack_00000178;
  char *in_stack_00000180;
  int64_t in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  unkbyte10 *local_48;
  unkbyte10 *local_40;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSFMatrix<long_double>>(in_RDI,0x21);
  vtt = (void **)(**(code **)(*in_RSI + 0x60))();
  (**(code **)(*in_RSI + 0x60))();
  TPZMatrix<long_double>::TPZMatrix
            ((TPZMatrix<long_double> *)in_RDI,vtt,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  *(undefined ***)in_RDI = &PTR__TPZSFMatrix_0242a420;
  uVar3 = (**(code **)(*(long *)in_RDI + 600))();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *(void **)(in_RDI + 0x20) = pvVar4;
  if (*(long *)(in_RDI + 0x20) == 0) {
    TPZMatrix<long_double>::Error(in_stack_00000180,in_stack_00000178);
  }
  local_40 = (unkbyte10 *)in_RSI[4];
  local_48 = *(unkbyte10 **)(in_RDI + 0x20);
  lVar1 = *(long *)(in_RDI + 0x20);
  lVar5 = (**(code **)(*(long *)in_RDI + 600))();
  while (local_48 < (unkbyte10 *)(lVar1 + lVar5 * 0x10)) {
    *local_48 = *local_40;
    local_48 = local_48 + 1;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix (const TPZSFMatrix<TVar>  & A)
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar> ( A.Dim(), A.Dim() )
{
    int64_t size = Size();
	fElem = new TVar[size] ;
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Copia a matriz
	TVar *src = A.fElem;
	TVar *dst = fElem;
	TVar *end = &fElem[Size()];
	while ( dst < end )
		*dst++ = *src++;
}